

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void FindHoveredWindow(void)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  ImVec2 hole_size;
  ImVec2 hole_pos;
  ImRect bb;
  ImGuiWindow *window;
  int i;
  ImVec2 padding_for_resize_from_edges;
  ImVec2 padding_regular;
  ImGuiWindow *hovered_window_ignoring_moving_window;
  ImGuiWindow *hovered_window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff58;
  ImVec2 *in_stack_ffffffffffffff60;
  ImGuiWindow *pIVar3;
  ImVec2 *in_stack_ffffffffffffff68;
  ImVec2 local_78;
  ImRect local_70;
  ImVec2 local_60;
  ImVec2 local_58;
  ImRect local_50;
  ImGuiWindow *local_40;
  int local_34;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImGuiWindow *local_18;
  ImGuiWindow *local_10;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  local_10 = (ImGuiWindow *)0x0;
  local_18 = (ImGuiWindow *)0x0;
  if ((GImGui->MovingWindow != (ImGuiWindow *)0x0) && ((GImGui->MovingWindow->Flags & 0x200U) == 0))
  {
    local_10 = GImGui->MovingWindow;
  }
  local_28 = (GImGui->Style).TouchExtraPadding;
  local_20 = local_28;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges & 1U) != 0) {
    ImVec2::ImVec2(&local_30,4.0,4.0);
    local_28 = ImMax(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  }
  local_34 = (local_8->Windows).Size;
LAB_0031b457:
  do {
    do {
      local_34 = local_34 + -1;
      if (local_34 < 0) goto LAB_0031b693;
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&local_8->Windows,local_34);
      local_40 = *ppIVar2;
    } while ((((local_40->Active & 1U) == 0) || ((local_40->Hidden & 1U) != 0)) ||
            ((local_40->Flags & 0x200U) != 0));
    local_50.Min = (local_40->OuterRectClipped).Min;
    local_50.Max = (local_40->OuterRectClipped).Max;
    if ((local_40->Flags & 0x1000042U) == 0) {
      ImRect::Expand(&local_50,&local_28);
    }
    else {
      ImRect::Expand(&local_50,&local_20);
    }
    bVar1 = ImRect::Contains(&local_50,&(local_8->IO).MousePos);
  } while (!bVar1);
  if ((local_40->HitTestHoleSize).x != 0) {
    ImVec2::ImVec2(&local_58,(local_40->Pos).x + (float)(int)(local_40->HitTestHoleOffset).x,
                   (local_40->Pos).y + (float)(int)(local_40->HitTestHoleOffset).y);
    ImVec2::ImVec2(&local_60,(float)(int)(local_40->HitTestHoleSize).x,
                   (float)(int)(local_40->HitTestHoleSize).y);
    local_78 = operator+(in_stack_ffffffffffffff58,(ImVec2 *)0x31b5bf);
    ImRect::ImRect(&local_70,&local_58,&local_78);
    bVar1 = ImRect::Contains(&local_70,&(local_8->IO).MousePos);
    if (bVar1) goto LAB_0031b457;
  }
  if (local_10 == (ImGuiWindow *)0x0) {
    local_10 = local_40;
  }
  if ((local_18 == (ImGuiWindow *)0x0) &&
     ((local_8->MovingWindow == (ImGuiWindow *)0x0 ||
      (local_40->RootWindow != local_8->MovingWindow->RootWindow)))) {
    local_18 = local_40;
  }
  if ((local_10 != (ImGuiWindow *)0x0) && (local_18 != (ImGuiWindow *)0x0)) {
LAB_0031b693:
    local_8->HoveredWindow = local_10;
    if (local_8->HoveredWindow == (ImGuiWindow *)0x0) {
      pIVar3 = (ImGuiWindow *)0x0;
    }
    else {
      pIVar3 = local_8->HoveredWindow->RootWindow;
    }
    local_8->HoveredRootWindow = pIVar3;
    local_8->HoveredWindowUnderMovingWindow = local_18;
    return;
  }
  goto LAB_0031b457;
}

Assistant:

static void FindHoveredWindow()
{
    ImGuiContext& g = *GImGui;

    ImGuiWindow* hovered_window = NULL;
    ImGuiWindow* hovered_window_ignoring_moving_window = NULL;
    if (g.MovingWindow && !(g.MovingWindow->Flags & ImGuiWindowFlags_NoMouseInputs))
        hovered_window = g.MovingWindow;

    ImVec2 padding_regular = g.Style.TouchExtraPadding;
    ImVec2 padding_for_resize_from_edges = g.IO.ConfigWindowsResizeFromEdges ? ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS, WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS)) : padding_regular;
    for (int i = g.Windows.Size - 1; i >= 0; i--)
    {
        ImGuiWindow* window = g.Windows[i];
        if (!window->Active || window->Hidden)
            continue;
        if (window->Flags & ImGuiWindowFlags_NoMouseInputs)
            continue;

        // Using the clipped AABB, a child window will typically be clipped by its parent (not always)
        ImRect bb(window->OuterRectClipped);
        if (window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_AlwaysAutoResize))
            bb.Expand(padding_regular);
        else
            bb.Expand(padding_for_resize_from_edges);
        if (!bb.Contains(g.IO.MousePos))
            continue;

        // Support for one rectangular hole in any given window
        // FIXME: Consider generalizing hit-testing override (with more generic data, callback, etc.) (#1512)
        if (window->HitTestHoleSize.x != 0)
        {
            ImVec2 hole_pos(window->Pos.x + (float)window->HitTestHoleOffset.x, window->Pos.y + (float)window->HitTestHoleOffset.y);
            ImVec2 hole_size((float)window->HitTestHoleSize.x, (float)window->HitTestHoleSize.y);
            if (ImRect(hole_pos, hole_pos + hole_size).Contains(g.IO.MousePos))
                continue;
        }

        if (hovered_window == NULL)
            hovered_window = window;
        if (hovered_window_ignoring_moving_window == NULL && (!g.MovingWindow || window->RootWindow != g.MovingWindow->RootWindow))
            hovered_window_ignoring_moving_window = window;
        if (hovered_window && hovered_window_ignoring_moving_window)
            break;
    }

    g.HoveredWindow = hovered_window;
    g.HoveredRootWindow = g.HoveredWindow ? g.HoveredWindow->RootWindow : NULL;
    g.HoveredWindowUnderMovingWindow = hovered_window_ignoring_moving_window;
}